

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_javax_generated_annotation(t_java_generator *this,ostream *out)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  string local_48 [32];
  tm *local_28;
  tm *now;
  time_t seconds;
  ostream *out_local;
  t_java_generator *this_local;
  
  seconds = (time_t)out;
  out_local = (ostream *)this;
  now = (tm *)time((time_t *)0x0);
  local_28 = localtime((time_t *)&now);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)seconds);
  poVar3 = std::operator<<(poVar3,"@javax.annotation.Generated(value = \"");
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1d])();
  poVar3 = std::operator<<(poVar3,local_48);
  std::operator<<(poVar3,"\"");
  std::__cxx11::string::~string(local_48);
  if ((this->undated_generated_annotations_ & 1U) == 0) {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)seconds);
    poVar3 = std::operator<<(poVar3,", date = \"");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28->tm_year + 0x76c);
    poVar3 = std::operator<<(poVar3,"-");
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28->tm_mon + 1);
    poVar3 = std::operator<<(poVar3,"-");
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28->tm_mday);
    poVar3 = std::operator<<(poVar3,"\")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar3 = std::operator<<((ostream *)seconds,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_java_generator::generate_javax_generated_annotation(ostream& out) {
  time_t seconds = time(nullptr);
  struct tm* now = localtime(&seconds);
  indent(out) << "@javax.annotation.Generated(value = \"" << autogen_summary() << "\"";
  if (undated_generated_annotations_) {
    out << ")" << endl;
  } else {
    indent(out) << ", date = \"" << (now->tm_year + 1900) << "-" << setfill('0') << setw(2)
                << (now->tm_mon + 1) << "-" << setfill('0') << setw(2) << now->tm_mday
                << "\")" << endl;
  }
}